

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpx_rac.c
# Opt level: O2

int vpx_rac_get_prob_branchy(VpxRangeCoder *c,int prob)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  
  uVar2 = vpx_rac_renorm(c);
  iVar3 = ((c->high + -1) * prob >> 8) + 1;
  bVar5 = (uint)(iVar3 * 0x10000) <= uVar2;
  iVar1 = c->high - iVar3;
  if (!bVar5) {
    iVar1 = iVar3;
  }
  uVar4 = 0;
  if (bVar5) {
    uVar4 = iVar3 * 0x10000;
  }
  c->high = iVar1;
  c->code_word = uVar2 - uVar4;
  return (int)bVar5;
}

Assistant:

int vpx_rac_get_prob_branchy(VpxRangeCoder *c, int prob)
{
    unsigned long code_word = vpx_rac_renorm(c);
    unsigned low = 1 + (((c->high - 1) * prob) >> 8);
    unsigned low_shift = low << 16;

    if (code_word >= low_shift) {
        c->high     -= low;
        c->code_word = code_word - low_shift;
        return 1;
    }

    c->high = low;
    c->code_word = code_word;
    return 0;
}